

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfsfileengine_iterator.cpp
# Opt level: O0

void __thiscall
QFSFileEngineIterator::QFSFileEngineIterator
          (QFSFileEngineIterator *this,QString *path,IteratorFlags filters,QStringList *filterNames)

{
  long lVar1;
  undefined8 in_RCX;
  QFileSystemIterator *in_RDI;
  long in_FS_OFFSET;
  QStringList *in_stack_ffffffffffffff80;
  QFileSystemEntry *this_00;
  QString *in_stack_ffffffffffffff88;
  QAbstractFileEngineIterator *in_stack_ffffffffffffff90;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QAbstractFileEngineIterator::QAbstractFileEngineIterator
            (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,
             (QFlagsStorageHelper<QDirListing::IteratorFlag,_4>)SUB84((ulong)in_RCX >> 0x20,0),
             in_stack_ffffffffffffff80);
  (in_RDI->dirPath).d.d = (Data *)&PTR__QFSFileEngineIterator_001e1678;
  this_00 = (QFileSystemEntry *)&(in_RDI->toUtf16).super_QStringConverter.state.invalidChars;
  operator_new(0x68);
  QFileSystemEntry::QFileSystemEntry(this_00,&in_RDI->dirPath);
  QFileSystemIterator::QFileSystemIterator
            (in_RDI,(QFileSystemEntry *)0x12e958,
             (QFlagsStorageHelper<QDirListing::IteratorFlag,_4>)SUB84((ulong)this_00 >> 0x20,0));
  std::unique_ptr<QFileSystemIterator,std::default_delete<QFileSystemIterator>>::
  unique_ptr<std::default_delete<QFileSystemIterator>,void>
            ((unique_ptr<QFileSystemIterator,_std::default_delete<QFileSystemIterator>_> *)this_00,
             in_RDI);
  QFileSystemEntry::~QFileSystemEntry(this_00);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QFSFileEngineIterator::QFSFileEngineIterator(const QString &path, QDirListing::IteratorFlags filters,
                                             const QStringList &filterNames)
    : QAbstractFileEngineIterator(path, filters, filterNames),
      nativeIterator(new QFileSystemIterator(QFileSystemEntry(path), filters))
{
}